

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

void absl::numbers_internal::PutTwoDigits(uint32_t i,Nonnull<char_*> buf)

{
  if (i < 100) {
    *(short *)buf = (short)i * 0x100 + (short)(i * 0x67 >> 10) * -0x9ff + 0x3030;
    return;
  }
  __assert_fail("i < 100",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                ,0x11f,"void absl::numbers_internal::PutTwoDigits(uint32_t, absl::Nonnull<char *>)")
  ;
}

Assistant:

void numbers_internal::PutTwoDigits(uint32_t i, absl::Nonnull<char*> buf) {
  assert(i < 100);
  uint32_t base = kTwoZeroBytes;
  uint32_t div10 = (i * kDivisionBy10Mul) / kDivisionBy10Div;
  uint32_t mod10 = i - 10u * div10;
  base += div10 + (mod10 << 8);
  little_endian::Store16(buf, static_cast<uint16_t>(base));
}